

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpBrReg1Unsigned1<Js::OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data_local;
  OpCode op_local;
  
  DumpOffset((int)data->RelativeJumpOffset,reader);
  DumpReg(data->R1);
  DumpU4(data->C2);
  return;
}

Assistant:

void ByteCodeDumper::DumpBrReg1Unsigned1(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpOffset(data->RelativeJumpOffset, reader);
        DumpReg(data->R1);
        DumpU4(data->C2);
    }